

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O3

void __thiscall
kratos::SequentialStmtBlock::add_condition
          (SequentialStmtBlock *this,
          pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> *condition)

{
  pointer *ppEVar1;
  EventEdgeType edge;
  pointer pEVar2;
  Var *var;
  iterator __position;
  pointer pEVar3;
  pointer pEVar4;
  long lVar5;
  ulong uVar6;
  EventControl local_30;
  
  pEVar4 = (this->conditions_).
           super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar2 = (this->conditions_).
           super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>._M_impl.
           super__Vector_impl_data._M_finish;
  edge = condition->first;
  var = (condition->second).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar6 = (long)pEVar2 - (long)pEVar4;
  if (0 < (long)uVar6 >> 7) {
    pEVar3 = (pointer)((long)&pEVar4->delay + (uVar6 & 0xffffffffffffff80));
    lVar5 = ((long)uVar6 >> 7) + 1;
    pEVar4 = pEVar4 + 2;
    do {
      if ((pEVar4[-2].var == var) && (pEVar4[-2].edge == edge)) {
        pEVar4 = pEVar4 + -2;
        goto LAB_003711dc;
      }
      if ((pEVar4[-1].var == var) && (pEVar4[-1].edge == edge)) {
        pEVar4 = pEVar4 + -1;
        goto LAB_003711dc;
      }
      if ((pEVar4->var == var) && (pEVar4->edge == edge)) goto LAB_003711dc;
      if ((pEVar4[1].var == var) && (pEVar4[1].edge == edge)) {
        pEVar4 = pEVar4 + 1;
        goto LAB_003711dc;
      }
      lVar5 = lVar5 + -1;
      pEVar4 = pEVar4 + 4;
    } while (1 < lVar5);
    uVar6 = (long)pEVar2 - (long)pEVar3;
    pEVar4 = pEVar3;
  }
  lVar5 = (long)uVar6 >> 5;
  if (lVar5 == 1) {
LAB_003711bc:
    if ((pEVar4->var != var) || (pEVar4->edge != edge)) goto LAB_003711e1;
  }
  else if (lVar5 == 2) {
LAB_003711ad:
    if ((pEVar4->var != var) || (pEVar4->edge != edge)) {
      pEVar4 = pEVar4 + 1;
      goto LAB_003711bc;
    }
  }
  else {
    if (lVar5 != 3) goto LAB_003711e1;
    if ((pEVar4->var != var) || (pEVar4->edge != edge)) {
      pEVar4 = pEVar4 + 1;
      goto LAB_003711ad;
    }
  }
LAB_003711dc:
  if (pEVar4 != pEVar2) {
    return;
  }
LAB_003711e1:
  EventControl::EventControl(&local_30,edge,var);
  __position._M_current =
       (this->conditions_).
       super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->conditions_).
      super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>::
    _M_realloc_insert<kratos::EventControl>(&this->conditions_,__position,&local_30);
  }
  else {
    (__position._M_current)->type = local_30.type;
    (__position._M_current)->edge = local_30.edge;
    (__position._M_current)->delay_side = local_30.delay_side;
    *(undefined4 *)&(__position._M_current)->field_0x1c = local_30._28_4_;
    (__position._M_current)->delay = local_30.delay;
    (__position._M_current)->var = local_30.var;
    ppEVar1 = &(this->conditions_).
               super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppEVar1 = *ppEVar1 + 1;
  }
  return;
}

Assistant:

void SequentialStmtBlock::add_condition(
    const std::pair<EventEdgeType, std::shared_ptr<Var>> &condition) {
    // notice that the condition variable cannot be used as a condition
    // for now we only allow Port (clk and reset) type to use as conditions
    // make sure no duplicate
    auto pos = std::find_if(
        conditions_.begin(), conditions_.end(), [&condition](const EventControl &event) -> bool {
            return event.var == condition.second.get() && event.edge == condition.first;
        });
    if (pos != conditions_.end()) return;

    conditions_.emplace_back(EventControl(condition.first, *condition.second));
}